

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d80.cpp
# Opt level: O3

bool ReadD80(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  char extraout_AL;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  Data *data;
  sbyte sVar5;
  size_t in_RCX;
  uint uVar6;
  char *__stream;
  Format fmt;
  uint8_t ab [256];
  Format local_174;
  undefined1 local_138 [177];
  undefined2 local_87;
  byte local_85;
  ushort local_83;
  byte local_81;
  int local_6c;
  
  MemFile::rewind(file,(FILE *)disk);
  if (extraout_AL != '\0') {
    sVar4 = MemFile::read(file,(int)local_138,(void *)0x100,in_RCX);
    if ((char)sVar4 == '\0') {
      return false;
    }
    if (local_6c != 0x534f4453) {
      return false;
    }
    if (local_85 == local_81 && local_87 == local_83) {
      __stream = (char *)0x5;
      Format::Format(&local_174,D80);
      local_174.cyls = (int)local_87._1_1_;
      local_174.sectors = (int)local_85;
      local_174.heads = ((local_87 & 0x10) != 0) + 1;
      Format::Validate(&local_174);
      if (opt.fix != 0) {
        iVar2 = MemFile::size(file);
        iVar3 = Format::disk_size(&local_174);
        if (iVar2 != iVar3) {
          iVar2 = MemFile::size(file);
          iVar3 = Format::track_size(&local_174);
          sVar5 = (sbyte)(((byte)local_87 & 0x10) >> 4);
          uVar6 = iVar3 << sVar5;
          __stream = (char *)(ulong)uVar6;
          if (iVar2 % (int)uVar6 == 0) {
            iVar2 = MemFile::size(file);
            iVar3 = Format::track_size(&local_174);
            local_174.cyls = iVar2 / (iVar3 << sVar5) & 0xff;
            __stream = "corrected cylinder count to match disk size";
            Message<>(msgWarning,"corrected cylinder count to match disk size");
          }
        }
      }
      MemFile::rewind(file,(FILE *)__stream);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(this,&local_174,data,false);
      peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0d5d);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadD80(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    // Check the signature and the duplicate geometry block
    if (memcmp(ab + 204, D80_SIGNATURE, sizeof(D80_SIGNATURE) - 1) || memcmp(ab + 177, ab + 181, 3))
        return false;

    uint8_t heads = (ab[177] & 0x10) ? 2 : 1;
    uint8_t cyls = ab[178];
    uint8_t sectors = ab[179];

    Format fmt{ RegularFormat::D80 };
    fmt.cyls = cyls;
    fmt.heads = heads;
    fmt.sectors = sectors;
    fmt.Validate();

    // Allow cylinder count correction if the image size is a multiple of the track size
    if (opt.fix != 0 && file.size() != fmt.disk_size() && !(file.size() % (heads * fmt.track_size())))
    {
        fmt.cyls = static_cast<uint8_t>(file.size() / (heads * fmt.track_size()));
        Message(msgWarning, "corrected cylinder count to match disk size");
    }

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "D80";

    return true;
}